

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall
BpTree<float>::Redistribute
          (BpTree<float> *this,IndexNode<float> *C,IndexNode<float> *D,float k2,int i,int j)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  int iVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  bool bVar12;
  IndexNode<float> local_4a0;
  IndexNode<float> local_440;
  IndexNode<float> local_3e0;
  int local_380;
  int iStack_37c;
  int local_378;
  int iStack_374;
  IndexNode<float> local_370;
  Addr local_310;
  IndexNode<float> local_308;
  int local_2a8;
  int iStack_2a4;
  int local_2a0;
  int iStack_29c;
  IndexNode<float> local_298;
  Addr local_238;
  IndexNode<float> local_230;
  int local_1d0;
  int local_1cc;
  int n;
  int m;
  undefined1 local_1c0 [8];
  IndexNode<float> E;
  IndexNode<float> P;
  IndexNode<float> local_90;
  int local_2c;
  int local_28;
  int j_local;
  int i_local;
  float k2_local;
  IndexNode<float> *D_local;
  IndexNode<float> *C_local;
  BpTree<float> *this_local;
  
  local_2c = j;
  local_28 = i;
  j_local = (int)k2;
  _i_local = D;
  D_local = C;
  C_local = (IndexNode<float> *)this;
  IndexNode<float>::IndexNode(&local_90,C);
  LockNode(this,&local_90);
  IndexNode<float>::~IndexNode(&local_90);
  IndexNode<float>::IndexNode((IndexNode<float> *)&P.self,_i_local);
  LockNode(this,(IndexNode<float> *)&P.self);
  IndexNode<float>::~IndexNode((IndexNode<float> *)&P.self);
  IndexNode<float>::IndexNode((IndexNode<float> *)&E.self,this->N);
  IndexNode<float>::IndexNode((IndexNode<float> *)local_1c0,this->N);
  _n = D_local->parent;
  FindNode(this,_n,(IndexNode<float> *)&E.self);
  if (local_2c < local_28) {
    IndexNode<float>::IndexNode(&local_230,D_local);
    iVar7 = IsLeaf(this,&local_230);
    IndexNode<float>::~IndexNode(&local_230);
    if (iVar7 == 0) {
      local_1cc = 0;
      while( true ) {
        bVar12 = false;
        if (local_1cc < this->N) {
          pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                              (&_i_local->p,(long)local_1cc);
          bVar12 = pvVar10->FileOff != -1;
        }
        if (!bVar12) break;
        local_1cc = local_1cc + 1;
      }
      local_1cc = local_1cc + -1;
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                          (&D_local->p,(long)(this->N + -2));
      pvVar11 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                          (&D_local->p,(long)(this->N + -1));
      *pvVar11 = *pvVar10;
      for (local_1d0 = this->N + -2; iVar7 = j_local, 0 < local_1d0; local_1d0 = local_1d0 + -1) {
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&D_local->k,(long)(local_1d0 + -1));
        vVar1 = *pvVar9;
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&D_local->k,(long)local_1d0)
        ;
        *pvVar9 = vVar1;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&D_local->v,(long)(local_1d0 + -1));
        vVar2 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&D_local->v,(long)local_1d0);
        *pvVar8 = vVar2;
        pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                            (&D_local->p,(long)(local_1d0 + -1));
        pvVar11 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1d0);
        *pvVar11 = *pvVar10;
      }
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&D_local->k,0);
      *pvVar9 = (value_type)iVar7;
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&D_local->v,0);
      *pvVar8 = '1';
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&_i_local->p,(long)local_1cc);
      pvVar11 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,0);
      *pvVar11 = *pvVar10;
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&_i_local->p,(long)local_1cc);
      local_238.BlockNum = pvVar10->BlockNum;
      local_238.FileOff = pvVar10->FileOff;
      FindNode(this,local_238,(IndexNode<float> *)local_1c0);
      E.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)&D_local->self;
      IndexNode<float>::IndexNode(&local_298,(IndexNode<float> *)local_1c0);
      UpdateBlock(this,&local_298);
      IndexNode<float>::~IndexNode(&local_298);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&_i_local->k,(long)(local_1cc + -1));
      vVar1 = *pvVar9;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&P,(long)local_2c);
      *pvVar9 = vVar1;
      local_2a0 = -1;
      iStack_29c = -1;
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&_i_local->p,(long)local_1cc);
      vVar6.FileOff = iStack_29c;
      vVar6.BlockNum = local_2a0;
      *pvVar10 = vVar6;
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&_i_local->v,(long)(local_1cc + -1));
      *pvVar8 = '0';
    }
    else {
      local_1cc = 0;
      while( true ) {
        bVar12 = false;
        if (local_1cc < this->N + -1) {
          pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&_i_local->v,(long)local_1cc);
          bVar12 = *pvVar8 == '1';
        }
        if (!bVar12) break;
        local_1cc = local_1cc + 1;
      }
      local_1cc = local_1cc + -1;
      for (local_1d0 = this->N + -2; 0 < local_1d0; local_1d0 = local_1d0 + -1) {
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&D_local->k,(long)(local_1d0 + -1));
        vVar1 = *pvVar9;
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&D_local->k,(long)local_1d0)
        ;
        *pvVar9 = vVar1;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&D_local->v,(long)(local_1d0 + -1));
        vVar2 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&D_local->v,(long)local_1d0);
        *pvVar8 = vVar2;
        pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                            (&D_local->p,(long)(local_1d0 + -1));
        pvVar11 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1d0);
        *pvVar11 = *pvVar10;
      }
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&_i_local->k,(long)local_1cc);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&D_local->k,0);
      *pvVar9 = vVar1;
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&D_local->v,0);
      *pvVar8 = '1';
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&_i_local->p,(long)local_1cc);
      pvVar11 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,0);
      *pvVar11 = *pvVar10;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&_i_local->k,(long)local_1cc);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&P,(long)local_2c);
      *pvVar9 = vVar1;
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&_i_local->v,(long)local_1cc);
      *pvVar8 = '0';
      local_2a8 = -1;
      iStack_2a4 = -1;
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&_i_local->p,(long)local_1cc);
      vVar5.FileOff = iStack_2a4;
      vVar5.BlockNum = local_2a8;
      *pvVar10 = vVar5;
    }
  }
  else {
    IndexNode<float>::IndexNode(&local_308,D_local);
    iVar7 = IsLeaf(this,&local_308);
    IndexNode<float>::~IndexNode(&local_308);
    if (iVar7 == 0) {
      local_1cc = 0;
      while( true ) {
        bVar12 = false;
        if (local_1cc < this->N) {
          pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                              (&D_local->p,(long)local_1cc);
          bVar12 = pvVar10->FileOff != -1;
        }
        iVar7 = j_local;
        if (!bVar12) break;
        local_1cc = local_1cc + 1;
      }
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&D_local->k,(long)(local_1cc + -1));
      *pvVar9 = (value_type)iVar7;
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&D_local->v,(long)(local_1cc + -1));
      *pvVar8 = '1';
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&_i_local->p,0);
      pvVar11 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1cc);
      *pvVar11 = *pvVar10;
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&_i_local->p,0);
      local_310.BlockNum = pvVar10->BlockNum;
      local_310.FileOff = pvVar10->FileOff;
      FindNode(this,local_310,(IndexNode<float> *)local_1c0);
      E.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)&D_local->self;
      IndexNode<float>::IndexNode(&local_370,(IndexNode<float> *)local_1c0);
      UpdateBlock(this,&local_370);
      IndexNode<float>::~IndexNode(&local_370);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&_i_local->k,0);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&P,(long)local_28);
      *pvVar9 = vVar1;
      for (local_1d0 = 1; local_1d0 < this->N + -1; local_1d0 = local_1d0 + 1) {
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&_i_local->k,(long)local_1d0);
        vVar1 = *pvVar9;
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&_i_local->k,(long)(local_1d0 + -1));
        *pvVar9 = vVar1;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&_i_local->v,(long)local_1d0);
        vVar2 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&_i_local->v,(long)(local_1d0 + -1));
        *pvVar8 = vVar2;
        pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&_i_local->p,(long)local_1d0)
        ;
        pvVar11 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                            (&_i_local->p,(long)(local_1d0 + -1));
        *pvVar11 = *pvVar10;
      }
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                          (&_i_local->p,(long)(this->N + -1));
      pvVar11 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                          (&_i_local->p,(long)(this->N + -2));
      *pvVar11 = *pvVar10;
      local_378 = -1;
      iStack_374 = -1;
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                          (&_i_local->p,(long)(this->N + -1));
      vVar4.FileOff = iStack_374;
      vVar4.BlockNum = local_378;
      *pvVar10 = vVar4;
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&_i_local->v,(long)(this->N + -2));
      *pvVar8 = '0';
    }
    else {
      local_1cc = 0;
      while( true ) {
        bVar12 = false;
        if (local_1cc < this->N + -1) {
          pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&D_local->v,(long)local_1cc)
          ;
          bVar12 = *pvVar8 == '1';
        }
        if (!bVar12) break;
        local_1cc = local_1cc + 1;
      }
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&_i_local->k,0);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&D_local->k,(long)local_1cc);
      *pvVar9 = vVar1;
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&D_local->v,(long)local_1cc);
      *pvVar8 = '1';
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&_i_local->p,0);
      pvVar11 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1cc);
      *pvVar11 = *pvVar10;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&_i_local->k,1);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&P,(long)local_28);
      *pvVar9 = vVar1;
      for (local_1d0 = 1; local_1d0 < this->N + -1; local_1d0 = local_1d0 + 1) {
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&_i_local->k,(long)local_1d0);
        vVar1 = *pvVar9;
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&_i_local->k,(long)(local_1d0 + -1));
        *pvVar9 = vVar1;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](&_i_local->v,(long)local_1d0);
        vVar2 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&_i_local->v,(long)(local_1d0 + -1));
        *pvVar8 = vVar2;
        pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&_i_local->p,(long)local_1d0)
        ;
        pvVar11 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                            (&_i_local->p,(long)(local_1d0 + -1));
        *pvVar11 = *pvVar10;
      }
      local_380 = -1;
      iStack_37c = -1;
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                          (&_i_local->p,(long)(this->N + -2));
      vVar3.FileOff = iStack_37c;
      vVar3.BlockNum = local_380;
      *pvVar10 = vVar3;
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&_i_local->v,(long)(this->N + -2));
      *pvVar8 = '0';
    }
  }
  IndexNode<float>::IndexNode(&local_3e0,D_local);
  UpdateBlock(this,&local_3e0);
  IndexNode<float>::~IndexNode(&local_3e0);
  IndexNode<float>::IndexNode(&local_440,_i_local);
  UpdateBlock(this,&local_440);
  IndexNode<float>::~IndexNode(&local_440);
  IndexNode<float>::IndexNode(&local_4a0,(IndexNode<float> *)&E.self);
  UpdateBlock(this,&local_4a0);
  IndexNode<float>::~IndexNode(&local_4a0);
  IndexNode<float>::~IndexNode((IndexNode<float> *)local_1c0);
  IndexNode<float>::~IndexNode((IndexNode<float> *)&E.self);
  return;
}

Assistant:

void BpTree<K>::Redistribute(IndexNode<K>& C, IndexNode<K>& D, K k2, int i, int j) {
	this->LockNode(C);
	this->LockNode(D);
	IndexNode<K> P(N);
	IndexNode<K> E(N);
	this->FindNode(C.parent, P);
	int m, n;
	//�������������
	if (j < i) {
		//D��C������
		if (!this->IsLeaf(C)) {
			for (m = 0; m < N && D.p[m].FileOff != -1; m++);
			m--;		//D.p[m]��D�����һ����Чָ��
			C.p[N - 1] = C.p[N - 2];
			for (n = N - 2; n >= 1; n--) {
				C.k[n] = C.k[n - 1];
				C.v[n] = C.v[n - 1];
				C.p[n] = C.p[n - 1];
			}
			C.k[0] = k2;
			C.v[0] = '1';
			C.p[0] = D.p[m];							//�ֳ�����һ�����C��
			this->FindNode(D.p[m], E);
			E.parent = C.self;		//���±��ƶ����ĸ���
			this->UpdateBlock(E);
			P.k[j] = D.k[m - 1];						//����CD֮��ļ�ֵ
			D.p[m] = { -1,-1 };
			D.v[m - 1] = '0';							//ɾ��D�б��ֳ�ȥ����һ��
		}
		else {
			for (m = 0; m < N - 1 && D.v[m] == '1'; m++);
			m--;		//(D.p[m],D.k[m])��D�����һ����Ч����
			for (n = N - 2; n >= 1; n--) {
				C.k[n] = C.k[n - 1];
				C.v[n] = C.v[n - 1];
				C.p[n] = C.p[n - 1];
			}
			C.k[0] = D.k[m];
			C.v[0] = '1';
			C.p[0] = D.p[m];							//�ֳ�����һ�����C��
			P.k[j] = D.k[m];		//����CD֮��ļ�ֵ
			D.v[m] = '0';
			D.p[m] = { -1, -1 };						//ɾ��D�б��ֳ�ȥ����һ��
		}
	}
	else {
		//D��C������
		if (!this->IsLeaf(C)) {
			for (m = 0; m < N && C.p[m].FileOff != -1; m++);		//C.p[m]��C.k[m-1]�ǿյ�
			C.k[m - 1] = k2;
			C.v[m - 1] = '1';
			C.p[m] = D.p[0];
			this->FindNode(D.p[0], E);
			E.parent = C.self;
			this->UpdateBlock(E);
			P.k[i] = D.k[0];
			for (n = 1; n < N - 1; n++) {
				D.k[n - 1] = D.k[n];
				D.v[n - 1] = D.v[n];
				D.p[n - 1] = D.p[n];
			}
			D.p[N - 2] = D.p[N - 1];
			D.p[N - 1] = { -1, -1 };
			D.v[N - 2] = '0';
		}
		else {
			for (m = 0; m < N - 1 && C.v[m] == '1'; m++);		//C.k[m]��C.p[m]�ǿյ�
			C.k[m] = D.k[0];
			C.v[m] = '1';
			C.p[m] = D.p[0];
			P.k[i] = D.k[1];
			for (n = 1; n < N - 1; n++) {
				D.k[n - 1] = D.k[n];
				D.v[n - 1] = D.v[n];
				D.p[n - 1] = D.p[n];
			}
			D.p[N - 2] = { -1, -1 };
			D.v[N - 2] = '0';
		}
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	this->UpdateBlock(P);
	return;
}